

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PL_approximation.h
# Opt level: O0

VectorXd __thiscall
Gudhi::coxeter_triangulation::
PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
::operator()(PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
             *this,VectorXd *p)

{
  Index *__return_storage_ptr__;
  Scalar SVar1;
  double dVar2;
  type_conflict tVar3;
  size_t sVar4;
  size_t sVar5;
  Scalar *pSVar6;
  reference __x;
  Scalar *pSVar7;
  CoeffReturnType pdVar8;
  size_t in_RDX;
  Index extraout_RDX;
  VectorXd VVar9;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_2d0;
  undefined1 local_2b9;
  ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_2b8;
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_218;
  undefined1 local_208 [8];
  VectorXd lambda;
  size_t i_3;
  undefined1 local_1e8 [8];
  VectorXd z;
  size_t i_2;
  size_t i_1;
  VectorXd fun_v;
  VectorXd pt_v;
  vector<int,_std::allocator<int>_> v;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  __end0;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  __begin0;
  Vertex_range *__range3;
  size_t j;
  size_t i;
  unsigned_long local_b0;
  undefined1 local_a8 [8];
  MatrixXd vertex_matrix;
  unsigned_long local_80;
  undefined1 local_78 [8];
  MatrixXd matrix;
  Simplex_handle s;
  size_t amb_d;
  size_t cod_d;
  VectorXd *p_local;
  PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
  *this_local;
  VectorXd *result;
  
  cod_d = in_RDX;
  p_local = p;
  this_local = this;
  amb_d = PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
          ::cod_d((PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                   *)p);
  sVar4 = PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
          ::amb_d((PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                   *)p);
  __return_storage_ptr__ =
       &matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
  ::locate_point<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Simplex_handle *)__return_storage_ptr__,p + 3,(Matrix<double,__1,_1,_0,__1,_1> *)cod_d
             ,1.0);
  sVar5 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ::dimension((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                       *)__return_storage_ptr__);
  local_80 = sVar5 + 1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,unsigned_long>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_78,&amb_d,&local_80);
  local_b0 = sVar4 + 1;
  sVar5 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ::dimension((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                       *)&matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_cols);
  i = sVar5 + 1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,unsigned_long>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_a8,&local_b0,&i);
  for (j = 0; sVar5 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      ::dimension((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                   *)&matrix.
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                      .m_storage.m_cols), j < sVar5 + 1; j = j + 1) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_a8,0,j
                       );
    *pSVar6 = 1.0;
  }
  __range3 = (Vertex_range *)0x0;
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::vertex_range((Vertex_range *)&__begin0.is_end_,
                 (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  *)&matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_cols);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  ::begin((Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           *)&__end0.is_end_,
          (iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
           *)&__begin0.is_end_);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  ::end((Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         *)&v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage,
        (iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
         *)&__begin0.is_end_);
  while (tVar3 = boost::iterators::operator!=
                           ((iterator_facade<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_std::vector<int,_std::allocator<int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<int,_std::allocator<int>_>_&,_long>
                             *)&__end0.is_end_,
                            (iterator_facade<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_std::vector<int,_std::allocator<int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<int,_std::allocator<int>_>_&,_long>
                             *)&v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage), tVar3) {
    __x = boost::iterators::detail::
          iterator_facade_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_std::vector<int,_std::allocator<int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<int,_std::allocator<int>_>_&,_long,_false,_false>
          ::operator*((iterator_facade_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_std::vector<int,_std::allocator<int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<int,_std::allocator<int>_>_&,_long,_false,_false>
                       *)&__end0.is_end_);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &pt_v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
               ,__x);
    Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::cartesian_coordinates
              ((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                *)&fun_v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows,(Vertex_handle *)(p + 3),1.0);
    Function_Sm_in_Rd::operator()((Function_Sm_in_Rd *)&i_1,p);
    for (i_2 = 1; i_2 < sVar4 + 1; i_2 = i_2 + 1) {
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &fun_v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows,i_2 - 1);
      SVar1 = *pSVar7;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_a8,
                          i_2,(Index)__range3);
      *pSVar6 = SVar1;
    }
    for (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
        (ulong)z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
        amb_d; z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
                    z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows + 1) {
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&i_1,
                          z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows);
      SVar1 = *pSVar7;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_78,
                          z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows,(Index)__range3);
      *pSVar6 = SVar1;
    }
    __range3 = (Vertex_range *)
               ((long)&(__range3->
                       super_iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
                       ).m_Begin.o_it_._M_current + 1);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&i_1);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &fun_v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &pt_v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              );
    boost::iterators::detail::
    iterator_facade_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_std::vector<int,_std::allocator<int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<int,_std::allocator<int>_>_&,_long,_false,_false>
    ::operator++((iterator_facade_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_std::vector<int,_std::allocator<int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<int,_std::allocator<int>_>_&,_long,_false,_false>
                  *)&__end0.is_end_);
  }
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~Vertex_iterator((Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      *)&v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~Vertex_iterator((Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      *)&__end0.is_end_);
  boost::
  iterator_range<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
  ::~iterator_range((iterator_range<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                     *)&__begin0.is_end_);
  sVar5 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ::dimension((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                       *)&matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_cols);
  if (__range3 != (Vertex_range *)(sVar5 + 1)) {
    __assert_fail("j == s.dimension() + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/include/gudhi/Functions/PL_approximation.h"
                  ,0x35,
                  "Eigen::VectorXd Gudhi::coxeter_triangulation::PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd, Gudhi::coxeter_triangulation::Coxeter_triangulation<>>::operator()(const Eigen::VectorXd &) const [Function_ = Gudhi::coxeter_triangulation::Function_Sm_in_Rd, Triangulation_ = Gudhi::coxeter_triangulation::Coxeter_triangulation<>]"
                 );
  }
  i_3 = sVar4 + 1;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_1e8,&i_3);
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1e8,0);
  *pSVar7 = 1.0;
  for (lambda.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 1;
      (ulong)lambda.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      < sVar4 + 1;
      lambda.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           lambda.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows +
           1) {
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)cod_d,
                        lambda.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows + -1);
    dVar2 = *pdVar8;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1e8,
                        lambda.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows);
    *pSVar7 = dVar2;
  }
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::colPivHouseholderQr
            (&local_2b8,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a8);
  local_218 = Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
              solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                        ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                          *)&local_2b8,
                         (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1e8);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_208,
             (EigenBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_218);
  Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~ColPivHouseholderQR
            (&local_2b8);
  local_2b9 = 0;
  local_2d0 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_78,
                         (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_208);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((Matrix<double,_1,1,0,_1,1> *)this,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)&local_2d0);
  local_2b9 = 1;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_208);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_1e8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_a8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_78);
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::~Permutahedral_representation
            ((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              *)&matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_cols);
  VVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd operator()(const Eigen::VectorXd& p) const {
    std::size_t cod_d = this->cod_d();
    std::size_t amb_d = this->amb_d();
    auto s = tr_.locate_point(p);
    Eigen::MatrixXd matrix(cod_d, s.dimension() + 1);
    Eigen::MatrixXd vertex_matrix(amb_d + 1, s.dimension() + 1);
    for (std::size_t i = 0; i < s.dimension() + 1; ++i) vertex_matrix(0, i) = 1;
    std::size_t j = 0;
    for (auto v : s.vertex_range()) {
      Eigen::VectorXd pt_v = tr_.cartesian_coordinates(v);
      Eigen::VectorXd fun_v = fun_(pt_v);
      for (std::size_t i = 1; i < amb_d + 1; ++i) vertex_matrix(i, j) = pt_v(i - 1);
      for (std::size_t i = 0; i < cod_d; ++i) matrix(i, j) = fun_v(i);
      j++;
    }
    assert(j == s.dimension() + 1);
    Eigen::VectorXd z(amb_d + 1);
    z(0) = 1;
    for (std::size_t i = 1; i < amb_d + 1; ++i) z(i) = p(i - 1);
    Eigen::VectorXd lambda = vertex_matrix.colPivHouseholderQr().solve(z);
    Eigen::VectorXd result = matrix * lambda;
    return result;
  }